

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entries_delete(zip_t *zip,char **entries,size_t len)

{
  zip_entry_mark_t *entry_mark_00;
  zip_t *pzVar1;
  zip_entry_mark_t *entry_mark;
  ssize_t err;
  ssize_t n;
  size_t len_local;
  char **entries_local;
  zip_t *zip_local;
  
  if ((zip == (zip_t *)0x0) || ((entries == (char **)0x0 && (len != 0)))) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else if ((entries == (char **)0x0) && (len == 0)) {
    zip_local = (zip_t *)0x0;
  }
  else {
    zip_local = (zip_t *)zip_entries_total(zip);
    if (-1 < (long)zip_local) {
      entry_mark_00 = (zip_entry_mark_t *)calloc((size_t)zip_local,0x20);
      if (entry_mark_00 == (zip_entry_mark_t *)0x0) {
        zip_local = (zip_t *)0xffffffffffffffeb;
      }
      else {
        (zip->archive).m_zip_mode = MZ_ZIP_MODE_READING;
        pzVar1 = (zip_t *)zip_entry_set(zip,entry_mark_00,(size_t)zip_local,entries,len);
        if ((long)pzVar1 < 0) {
          zip_local = pzVar1;
          if (entry_mark_00 != (zip_entry_mark_t *)0x0) {
            free(entry_mark_00);
          }
        }
        else {
          zip_local = (zip_t *)zip_entries_delete_mark(zip,entry_mark_00,(int)zip_local);
          if (entry_mark_00 != (zip_entry_mark_t *)0x0) {
            free(entry_mark_00);
          }
        }
      }
    }
  }
  return (ssize_t)zip_local;
}

Assistant:

ssize_t zip_entries_delete(struct zip_t *zip, char *const entries[],
                           size_t len) {
  ssize_t n = 0;
  ssize_t err = 0;
  struct zip_entry_mark_t *entry_mark = NULL;

  if (zip == NULL || (entries == NULL && len != 0)) {
    return ZIP_ENOINIT;
  }

  if (entries == NULL && len == 0) {
    return 0;
  }

  n = zip_entries_total(zip);
  if (n < 0) {
    return n;
  }

  entry_mark = (struct zip_entry_mark_t *)calloc(
      (size_t)n, sizeof(struct zip_entry_mark_t));
  if (!entry_mark) {
    return ZIP_EOOMEM;
  }

  zip->archive.m_zip_mode = MZ_ZIP_MODE_READING;

  err = zip_entry_set(zip, entry_mark, (size_t)n, entries, len);
  if (err < 0) {
    CLEANUP(entry_mark);
    return err;
  }

  err = zip_entries_delete_mark(zip, entry_mark, (int)n);
  CLEANUP(entry_mark);
  return err;
}